

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O0

void __thiscall Assimp::FBX::Node::Node<char_const*>(Node *this,string *n,char *more)

{
  char *more_local;
  string *n_local;
  Node *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)n);
  (this->properties).
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->properties).
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->properties).
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>::
  vector(&this->properties);
  (this->children).super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::vector(&this->children);
  this->force_has_children = false;
  AddProperties<char_const*>(this,more);
  return;
}

Assistant:

Node(const std::string& n, const More... more)
    : name(n)
    , properties()
    , children()
    , force_has_children(false) {
        AddProperties(more...);
    }